

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::FilenameToClassname_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view filename)

{
  pointer pcVar1;
  size_type __n;
  size_t i;
  ulong uVar2;
  allocator<char> local_39;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  string_view filename_local;
  
  filename_local._M_str = (char *)filename._M_len;
  filename_local._M_len = (size_t)this;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                  (&filename_local,'.',0xffffffffffffffff);
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&filename_local,0,__n);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&local_38,&local_39);
  for (uVar2 = 0; uVar2 < __return_storage_ptr__->_M_string_length; uVar2 = uVar2 + 1) {
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if (pcVar1[uVar2] == '/') {
      pcVar1[uVar2] = '\\';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FilenameToClassname(absl::string_view filename) {
  size_t lastindex = filename.find_last_of('.');
  std::string result(filename.substr(0, lastindex));
  for (size_t i = 0; i < result.size(); i++) {
    if (result[i] == '/') {
      result[i] = '\\';
    }
  }
  return result;
}